

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.h
# Opt level: O1

void __thiscall
gpu::shared_device_buffer_typed<double>::shared_device_buffer_typed
          (shared_device_buffer_typed<double> *this,shared_device_buffer_typed<double> *other,
          size_t offset)

{
  long *plVar1;
  
  plVar1 = (long *)(other->super_shared_device_buffer).buffer_;
  (this->super_shared_device_buffer).buffer_ = (uchar *)plVar1;
  (this->super_shared_device_buffer).data_ = (other->super_shared_device_buffer).data_;
  (this->super_shared_device_buffer).type_ = (other->super_shared_device_buffer).type_;
  (this->super_shared_device_buffer).size_ = (other->super_shared_device_buffer).size_;
  (this->super_shared_device_buffer).offset_ =
       offset * 8 + (other->super_shared_device_buffer).offset_;
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + 1;
    UNLOCK();
  }
  return;
}

Assistant:

shared_device_buffer_typed(const shared_device_buffer_typed &other, size_t offset) : shared_device_buffer(other, offset * sizeof(T)) {}